

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ApplyStrainComputeElasticStress
          (TPZDecomposed *this,TPZTensor<TFad<6,_double>_> *Stress,REAL *K,REAL *G)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  TFad<6,_double> *pTVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  long lVar16;
  TFad<6,_double> *pTVar17;
  TFad<6,_double> *pTVar18;
  long lVar19;
  undefined1 auVar20 [16];
  double dVar21;
  TFad<6,_double> sig3;
  TFad<6,_double> sig2;
  TFad<6,_double> sig1;
  TFad<6,_double> trace_3;
  TFad<6,_double> trace;
  TPZTensor<TFad<6,_double>_> SigVol;
  double local_338 [6];
  undefined **local_308;
  double local_300;
  double local_2f8 [6];
  undefined **local_2c8;
  double local_2c0;
  undefined **local_2b8;
  double adStack_2b0 [5];
  undefined **local_288;
  double local_280;
  undefined **ppuStack_278;
  double adStack_270 [5];
  undefined **local_248;
  double local_240;
  double adStack_238 [6];
  TFad<6,_double> local_208;
  TPZTensor<TFad<6,_double>_> local_1c8;
  
  pTVar6 = (this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore;
  local_2c8 = &PTR__TFad_0185d2b8;
  local_2b8 = (undefined **)pTVar6->dx_[0];
  adStack_2b0[0] = pTVar6->dx_[1];
  adStack_2b0[1] = pTVar6->dx_[2];
  adStack_2b0[2] = pTVar6->dx_[3];
  adStack_2b0[3] = pTVar6->dx_[4];
  adStack_2b0[4] = pTVar6->dx_[5];
  dVar2 = pTVar6->val_;
  local_308 = &PTR__TFad_0185d2b8;
  local_2f8[0] = pTVar6[1].dx_[0];
  local_2f8[1] = pTVar6[1].dx_[1];
  local_2f8[2] = pTVar6[1].dx_[2];
  local_2f8[3] = pTVar6[1].dx_[3];
  local_2f8[4] = pTVar6[1].dx_[4];
  local_2f8[5] = pTVar6[1].dx_[5];
  dVar3 = pTVar6[1].val_;
  local_338[0] = pTVar6[2].dx_[0];
  local_338[1] = pTVar6[2].dx_[1];
  local_338[2] = pTVar6[2].dx_[2];
  local_338[3] = pTVar6[2].dx_[3];
  local_338[4] = pTVar6[2].dx_[4];
  local_338[5] = pTVar6[2].dx_[5];
  dVar4 = pTVar6[2].val_;
  local_248 = &PTR__TFad_0185d2b8;
  dVar21 = dVar2 + dVar3 + dVar4;
  lVar16 = 0;
  do {
    dVar10 = *(double *)((long)local_338 + lVar16 + 8) +
             *(double *)((long)local_2f8 + lVar16 + 8) + *(double *)((long)adStack_2b0 + lVar16);
    auVar20._8_4_ = SUB84(dVar10,0);
    auVar20._0_8_ =
         *(double *)((long)local_338 + lVar16) +
         *(double *)((long)local_2f8 + lVar16) + *(double *)((long)adStack_2b0 + lVar16 + -8);
    auVar20._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *(undefined1 (*) [16])((long)adStack_238 + lVar16) = auVar20;
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x30);
  dVar10 = dVar21 / 3.0;
  local_288 = &PTR__TFad_0185d2b8;
  lVar16 = 2;
  do {
    auVar20 = divpd(*(undefined1 (*) [16])(&local_248 + lVar16),_DAT_015276b0);
    *(undefined1 (*) [16])(&local_288 + lVar16) = auVar20;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 8);
  local_300 = dVar3;
  local_2c0 = dVar2;
  local_280 = dVar10;
  local_240 = dVar21;
  TPZTensor<TFad<6,_double>_>::TPZTensor(&local_1c8);
  dVar5 = *K;
  pdVar1 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_;
  lVar16 = 0;
  do {
    auVar11._8_4_ = SUB84(adStack_238[lVar16 + 1] * dVar5,0);
    auVar11._0_8_ = adStack_238[lVar16] * dVar5;
    auVar11._12_4_ = (int)((ulong)(adStack_238[lVar16 + 1] * dVar5) >> 0x20);
    *(undefined1 (*) [16])(pdVar1 + lVar16) = auVar11;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 6);
  dVar21 = dVar21 * dVar5;
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].val_ = dVar21;
  dVar5 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[1];
  dVar12 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[2];
  dVar13 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[3];
  dVar14 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[4];
  dVar15 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[5];
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[0] = *pdVar1;
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[1] = dVar5;
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[2] = dVar12;
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[3] = dVar13;
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[4] = dVar14;
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[5] = dVar15;
  local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[3].val_ = dVar21;
  dVar5 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[1];
  dVar12 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[2];
  dVar13 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[3];
  dVar14 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[4];
  dVar15 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[5];
  (local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[0] = *pdVar1;
  (local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[1] = dVar5;
  (local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[2] = dVar12;
  (local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[3] = dVar13;
  (local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[4] = dVar14;
  (local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[5] = dVar15;
  (local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore)->val_ = dVar21;
  pTVar6 = (Stress->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar16 = 2;
  do {
    auVar7._8_4_ = SUB84((&local_2c0)[lVar16] - (&local_280)[lVar16],0);
    auVar7._0_8_ = (double)(&local_2c8)[lVar16] - (double)(&local_288)[lVar16];
    auVar7._12_4_ = (int)((ulong)((&local_2c0)[lVar16] - (&local_280)[lVar16]) >> 0x20);
    *(undefined1 (*) [16])(pTVar6->dx_ + lVar16 + -2) = auVar7;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 8);
  pTVar6->val_ = dVar2 - dVar10;
  lVar16 = 0;
  do {
    auVar8._8_4_ = SUB84(local_2f8[lVar16 + 1] - (&local_280)[lVar16 + 2],0);
    auVar8._0_8_ = local_2f8[lVar16] - (&local_280)[lVar16 + 1];
    auVar8._12_4_ = (int)((ulong)(local_2f8[lVar16 + 1] - (&local_280)[lVar16 + 2]) >> 0x20);
    *(undefined1 (*) [16])(pTVar6[3].dx_ + lVar16) = auVar8;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 6);
  pTVar6[3].val_ = dVar3 - dVar10;
  lVar16 = 0;
  do {
    auVar9._8_4_ = SUB84(local_338[lVar16 + 1] - (&local_280)[lVar16 + 2],0);
    auVar9._0_8_ = local_338[lVar16] - (&local_280)[lVar16 + 1];
    auVar9._12_4_ = (int)((ulong)(local_338[lVar16 + 1] - (&local_280)[lVar16 + 2]) >> 0x20);
    *(undefined1 (*) [16])(pTVar6[5].dx_ + lVar16) = auVar9;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 6);
  pTVar6[5].val_ = dVar4 - dVar10;
  local_208.val_ = *G + *G;
  local_208.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_208.dx_[0] = 0.0;
  local_208.dx_[1] = 0.0;
  local_208.dx_[2] = 0.0;
  local_208.dx_[3] = 0.0;
  local_208.dx_[4] = 0.0;
  local_208.dx_[5] = 0.0;
  TPZTensor<TFad<6,_double>_>::operator*=(Stress,&local_208);
  pTVar6 = (Stress->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar16 = 0;
  pTVar17 = local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore;
  pTVar18 = pTVar6;
  do {
    lVar19 = 2;
    do {
      pTVar18->dx_[lVar19 + -2] = pTVar17->dx_[lVar19 + -2] + pTVar18->dx_[lVar19 + -2];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 8);
    pTVar6[lVar16].val_ =
         local_1c8.fData.super_TPZVec<TFad<6,_double>_>.fStore[lVar16].val_ + pTVar6[lVar16].val_;
    lVar16 = lVar16 + 1;
    pTVar18 = pTVar18 + 1;
    pTVar17 = pTVar17 + 1;
  } while (lVar16 != 6);
  local_1c8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f120;
  TPZManVector<TFad<6,_double>,_6>::~TPZManVector(&local_1c8.fData);
  return;
}

Assistant:

void ApplyStrainComputeElasticStress(TPZTensor<T> &Stress, REAL &K, REAL & G) {
            const T sig1 = this->fEigenvalues[0];
            const T sig2 = this->fEigenvalues[1];
            const T sig3 = this->fEigenvalues[2];
            const T trace = sig1 + sig2 + sig3;
            const T trace_3 = trace / 3.;

            TPZTensor<T> SigVol;
            SigVol.XX() = SigVol.YY() = SigVol.ZZ() = K * trace;

            Stress.XX() = sig1 - trace_3;
            Stress.YY() = sig2 - trace_3;
            Stress.ZZ() = sig3 - trace_3;
            Stress *= (2 * G);
            Stress += SigVol;
        }